

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syslog_sink.h
# Opt level: O1

void __thiscall spdlog::sinks::syslog_sink<std::mutex>::~syslog_sink(syslog_sink<std::mutex> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  formatter *pfVar3;
  
  (this->super_base_sink<std::mutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__syslog_sink_00566568;
  closelog();
  pcVar2 = (this->ident_)._M_dataplus._M_p;
  paVar1 = &(this->ident_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_base_sink<std::mutex>).super_sink._vptr_sink = (_func_int **)&PTR__base_sink_00566610
  ;
  pfVar3 = (this->super_base_sink<std::mutex>).formatter_._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  if (pfVar3 != (formatter *)0x0) {
    (*pfVar3->_vptr_formatter[1])();
  }
  (this->super_base_sink<std::mutex>).formatter_._M_t.
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)0x0;
  return;
}

Assistant:

~syslog_sink() override { ::closelog(); }